

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulatingstroker.cpp
# Opt level: O0

void __thiscall
QTriangulatingStroker::arcPoints
          (QTriangulatingStroker *this,float cx,float cy,float fromX,float fromY,float toX,float toY
          ,QVarLengthArray<float,_256LL> *points)

{
  double dVar1;
  double dVar2;
  long lVar3;
  bool bVar4;
  QVarLengthArray<float,_256LL> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float fVar5;
  float fVar6;
  float in_XMM1_Da;
  double dVar7;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  float tmpy_2;
  float tmpx_2;
  float tmpy_1;
  float tmpx_1;
  float tmpy;
  float tmpx;
  float dy2;
  float dx2;
  float dy1;
  float dx1;
  float *in_stack_ffffffffffffff78;
  QVarLengthArray<float,_256LL> *in_stack_ffffffffffffff80;
  float local_50;
  float local_4c;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = in_XMM3_Da - in_XMM1_Da;
  fVar5 = in_XMM4_Da - in_XMM0_Da;
  fVar6 = in_XMM5_Da - in_XMM1_Da;
  for (local_4c = in_XMM2_Da - in_XMM0_Da; local_4c * fVar6 + -(fVar5 * local_50) < 0.0;
      local_4c = (float)((double)local_4c * dVar1 + -(dVar7 * dVar2))) {
    dVar1 = *(double *)(in_RDI + 0x48);
    dVar7 = (double)local_50;
    dVar2 = *(double *)(in_RDI + 0x40);
    local_50 = (float)((double)local_4c * *(double *)(in_RDI + 0x40) +
                      (double)local_50 * *(double *)(in_RDI + 0x48));
    QVarLengthArray<float,_256LL>::append(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    QVarLengthArray<float,_256LL>::append(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  for (; local_4c * fVar5 + local_50 * fVar6 < 0.0;
      local_4c = (float)((double)local_4c * dVar1 + -(dVar7 * dVar2))) {
    dVar1 = *(double *)(in_RDI + 0x48);
    dVar7 = (double)local_50;
    dVar2 = *(double *)(in_RDI + 0x40);
    local_50 = (float)((double)local_4c * *(double *)(in_RDI + 0x40) +
                      (double)local_50 * *(double *)(in_RDI + 0x48));
    QVarLengthArray<float,_256LL>::append(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    QVarLengthArray<float,_256LL>::append(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  for (; 0.0 < local_4c * fVar6 + -(fVar5 * local_50);
      local_4c = (float)((double)local_4c * dVar1 + -(dVar7 * dVar2))) {
    dVar1 = *(double *)(in_RDI + 0x48);
    dVar7 = (double)local_50;
    dVar2 = *(double *)(in_RDI + 0x40);
    local_50 = (float)((double)local_4c * *(double *)(in_RDI + 0x40) +
                      (double)local_50 * *(double *)(in_RDI + 0x48));
    QVarLengthArray<float,_256LL>::append(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    QVarLengthArray<float,_256LL>::append(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  bVar4 = QVarLengthArray<float,_256LL>::isEmpty((QVarLengthArray<float,_256LL> *)0x674259);
  if (!bVar4) {
    QVLABaseBase::size((QVLABaseBase *)in_RSI);
    QVarLengthArray<float,_256LL>::resize(in_RSI,(qsizetype)in_stack_ffffffffffffff78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTriangulatingStroker::arcPoints(float cx, float cy, float fromX, float fromY, float toX, float toY, QVarLengthArray<float> &points)
{
    float dx1 = fromX - cx;
    float dy1 = fromY - cy;
    float dx2 = toX - cx;
    float dy2 = toY - cy;

    // while more than 180 degrees left:
    while (dx1 * dy2 - dx2 * dy1 < 0) {
        float tmpx = dx1 * m_cos_theta - dy1 * m_sin_theta;
        float tmpy = dx1 * m_sin_theta + dy1 * m_cos_theta;
        dx1 = tmpx;
        dy1 = tmpy;
        points.append(cx + dx1);
        points.append(cy + dy1);
    }

    // while more than 90 degrees left:
    while (dx1 * dx2 + dy1 * dy2 < 0) {
        float tmpx = dx1 * m_cos_theta - dy1 * m_sin_theta;
        float tmpy = dx1 * m_sin_theta + dy1 * m_cos_theta;
        dx1 = tmpx;
        dy1 = tmpy;
        points.append(cx + dx1);
        points.append(cy + dy1);
    }

    // while more than 0 degrees left:
    while (dx1 * dy2 - dx2 * dy1 > 0) {
        float tmpx = dx1 * m_cos_theta - dy1 * m_sin_theta;
        float tmpy = dx1 * m_sin_theta + dy1 * m_cos_theta;
        dx1 = tmpx;
        dy1 = tmpy;
        points.append(cx + dx1);
        points.append(cy + dy1);
    }

    // remove last point which was rotated beyond [toX, toY].
    if (!points.isEmpty())
        points.resize(points.size() - 2);
}